

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O1

vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_> *
__thiscall
program_options::command_line_parser::parse_long_option
          (vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
           *__return_storage_ptr__,command_line_parser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  style_t sVar2;
  value_type *__x;
  char *pcVar3;
  long lVar4;
  invalid_syntax *this_00;
  int option_style;
  string adjacent;
  string name;
  option opt;
  value_type local_d0;
  string local_b0;
  value_type local_90;
  
  (__return_storage_ptr__->
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __x = (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if (((2 < __x->_M_string_length) && (pcVar3 = (__x->_M_dataplus)._M_p, *pcVar3 == '-')) &&
     (pcVar3[1] == '-')) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    local_d0._M_string_length = 0;
    local_d0.field_2._M_local_buf[0] = '\0';
    lVar4 = std::__cxx11::string::find((char)__x,0x3d);
    if (lVar4 == -1) {
      std::__cxx11::string::substr((ulong)&local_90,(ulong)__x);
      std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.string_key._M_dataplus._M_p != &local_90.string_key.field_2) {
        operator_delete(local_90.string_key._M_dataplus._M_p,
                        CONCAT71(local_90.string_key.field_2._M_allocated_capacity._1_7_,
                                 local_90.string_key.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      std::__cxx11::string::substr((ulong)&local_90,(ulong)__x);
      std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_90);
      paVar1 = &local_90.string_key.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.string_key._M_dataplus._M_p != paVar1) {
        operator_delete(local_90.string_key._M_dataplus._M_p,
                        CONCAT71(local_90.string_key.field_2._M_allocated_capacity._1_7_,
                                 local_90.string_key.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::string::substr((ulong)&local_90,(ulong)__x);
      std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.string_key._M_dataplus._M_p != paVar1) {
        operator_delete(local_90.string_key._M_dataplus._M_p,
                        CONCAT71(local_90.string_key.field_2._M_allocated_capacity._1_7_,
                                 local_90.string_key.field_2._M_local_buf[0]) + 1);
      }
      if (local_d0._M_string_length == 0) {
        this_00 = (invalid_syntax *)__cxa_allocate_exception(0xc0);
        sVar2 = this->m_style;
        option_style = 1;
        if (((sVar2 & allow_long) == 0) && (option_style = 0x1000, (sVar2 >> 0xc & 1) == 0)) {
          option_style = 4;
          if ((~sVar2 & 6) != 0) {
            option_style = (uint)((~sVar2 & 10) == 0) << 3;
          }
        }
        invalid_syntax::invalid_syntax
                  (this_00,empty_adjacent_parameter,&local_b0,&local_b0,option_style);
        *(undefined ***)&(this_00->super_error_with_option_name).super_error =
             &PTR__error_with_option_name_001719c8;
        __cxa_throw(this_00,&invalid_command_line_syntax::typeinfo,
                    error_with_option_name::~error_with_option_name);
      }
    }
    paVar1 = &local_90.string_key.field_2;
    local_90.string_key._M_string_length = 0;
    local_90.string_key.field_2._M_local_buf[0] = '\0';
    local_90.position_key = -1;
    local_90.value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_90.original_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.original_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.original_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_90.unregistered = false;
    local_90.case_insensitive = false;
    local_90.string_key._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_assign((string *)&local_90);
    if (local_d0._M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_90.value,&local_d0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_90.original_tokens,__x);
    std::
    vector<program_options::basic_option<char>,_std::allocator<program_options::basic_option<char>_>_>
    ::push_back(__return_storage_ptr__,&local_90);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(args,(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_90.original_tokens);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_90.value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.string_key._M_dataplus._M_p != paVar1) {
      operator_delete(local_90.string_key._M_dataplus._M_p,
                      CONCAT71(local_90.string_key.field_2._M_allocated_capacity._1_7_,
                               local_90.string_key.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,
                      CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                               local_d0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,
                      CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                               local_b0.field_2._M_local_buf[0]) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<option>
command_line_parser::parse_long_option(std::vector<std::string>& args)
{
    std::vector<option> result;
    const std::string& tok = args[0];
    if (tok.size() >= 3 && tok[0] == '-' && tok[1] == '-')
    {
        std::string name, adjacent;

        std::string::size_type p = tok.find('=');
        if (p != tok.npos)
        {
            name = tok.substr(2, p-2);
            adjacent = tok.substr(p+1);
            if (adjacent.empty()) {
                throw invalid_command_line_syntax(
                    invalid_command_line_syntax::empty_adjacent_parameter,
                    name, name,
                    get_canonical_option_prefix());
            }
        }
        else
        {
            name = tok.substr(2);
        }
        option opt;
        opt.string_key = name;
        if (!adjacent.empty())
            opt.value.push_back(adjacent);
        opt.original_tokens.push_back(tok);
        result.push_back(opt);
        args.erase(args.begin());
    }
    return result;
}